

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

DoubletSet * GenerateDoubletTargets(DoubletSet *__return_storage_ptr__,DAM *am,DoubletType type)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  Gaussian cur2;
  Gaussian cur1;
  undefined1 local_70 [64];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cur1.ijk._M_elems[0] = (am->dam)._M_elems[0];
  iVar2 = (am->dam)._M_elems[1];
  iVar4 = ((cur1.ijk._M_elems[0] + 2) * (cur1.ijk._M_elems[0] + 1)) / 2;
  iVar2 = ((iVar2 + 2) * (iVar2 + 1)) / 2;
  cur1.ijk._M_elems[1] = 0;
  cur1.ijk._M_elems[2] = 0;
  iVar3 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar3;
  }
  if (iVar4 < 1) {
    iVar4 = iVar3;
  }
  for (; iVar3 != iVar4; iVar3 = iVar3 + 1) {
    cur2.ijk._M_elems[0] = (am->dam)._M_elems[1];
    cur2.ijk._M_elems[1] = 0;
    cur2.ijk._M_elems[2] = 0;
    iVar5 = iVar2;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      local_70._12_4_ = cur1.ijk._M_elems[2];
      local_70._8_4_ = cur1.ijk._M_elems[1];
      local_70._4_4_ = cur1.ijk._M_elems[0];
      local_70._24_4_ = cur2.ijk._M_elems[2];
      local_70._20_4_ = cur2.ijk._M_elems[1];
      local_70._16_4_ = cur2.ijk._M_elems[0];
      local_70._0_4_ = type;
      std::__cxx11::string::string((string *)(local_70 + 0x20),(string *)&am->tag);
      std::
      _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
      ::_M_insert_unique<Doublet>(&__return_storage_ptr__->_M_t,(Doublet *)local_70);
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
      Gaussian::Iterate(&cur2);
    }
    Gaussian::Iterate(&cur1);
  }
  return __return_storage_ptr__;
}

Assistant:

DoubletSet GenerateDoubletTargets(DAM am, DoubletType type)
{
    DoubletSet ds;
    int nam1 = ((am[0] + 1) * (am[0] + 2)) / 2;
    int nam2 = ((am[1] + 1) * (am[1] + 2)) / 2;

    Gaussian cur1 = Gaussian{am[0], 0, 0};
    for(int i = 0; i < nam1; i++)
    {
        Gaussian cur2 = Gaussian{am[1], 0, 0};
        for(int j = 0; j < nam2; j++)
        {
            ds.insert(Doublet{type, cur1, cur2, am.tag});
            cur2.Iterate();
        }
        cur1.Iterate();
    }
                
    return ds;
}